

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifSat.c
# Opt level: O0

int If_ManSatCheckXY(void *pSat,int nLutSize,word *pTruth,int nVars,uint uSet,word *pTBound,
                    word *pTFree,Vec_Int_t *vLits)

{
  int iVar1;
  int iVar2;
  int *begin;
  int *piVar3;
  word wVar4;
  byte bVar5;
  byte bVar6;
  word local_150;
  word Res;
  int nMintsLNew;
  int nMintsFNew;
  int mNew;
  int m;
  int Value;
  int v;
  int nMintsF;
  int nMintsL;
  int pFSet [15];
  int local_e0;
  int local_dc;
  int nFSet;
  int iFSet;
  int pSSet [15];
  int local_90;
  int local_8c;
  int nSSet;
  int iSSet;
  int pBSet [15];
  int local_44;
  int nBSet;
  int iBSet;
  sat_solver *p;
  word *pTBound_local;
  uint uSet_local;
  int nVars_local;
  word *pTruth_local;
  int nLutSize_local;
  void *pSat_local;
  
  pBSet[0xe] = 0;
  local_90 = 0;
  local_e0 = 0;
  bVar5 = (byte)nLutSize;
  v = 1 << (bVar5 & 0x1f);
  Value = 1 << ((char)(nLutSize << 1) - 1U & 0x1f);
  Dau_DecSortSet(uSet,nVars,pBSet + 0xe,&local_90,&local_e0);
  if (pBSet[0xe] + local_90 + local_e0 != nVars) {
    __assert_fail("nBSet + nSSet + nFSet == nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifSat.c"
                  ,0xa3,
                  "int If_ManSatCheckXY(void *, int, word *, int, unsigned int, word *, word *, Vec_Int_t *)"
                 );
  }
  if (nLutSize < local_90 + pBSet[0xe]) {
    __assert_fail("nSSet + nBSet <= nLutSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifSat.c"
                  ,0xa5,
                  "int If_ManSatCheckXY(void *, int, word *, int, unsigned int, word *, word *, Vec_Int_t *)"
                 );
  }
  if (nLutSize * 2 + -1 < nLutSize + local_90 + local_e0) {
    __assert_fail("nLutSize + nSSet + nFSet <= 2*nLutSize - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifSat.c"
                  ,0xa6,
                  "int If_ManSatCheckXY(void *, int, word *, int, unsigned int, word *, word *, Vec_Int_t *)"
                 );
  }
  Res._4_4_ = 1 << (bVar5 + (char)local_90 + (char)local_e0 & 0x1f);
  Vec_IntFill(vLits,Value,-1);
  for (nMintsFNew = 0; nMintsFNew < 1 << ((byte)nVars & 0x1f); nMintsFNew = nMintsFNew + 1) {
    local_dc = 0;
    local_8c = 0;
    local_44 = 0;
    nMintsLNew = 0;
    for (m = 0; m < nVars; m = m + 1) {
      mNew = uSet >> ((byte)(m << 1) & 0x1f) & 3;
      bVar6 = (byte)m;
      if (mNew == 0) {
        if ((nMintsFNew >> (bVar6 & 0x1f) & 1U) != 0) {
          nMintsLNew = 1 << (bVar5 + (char)local_90 + (char)local_dc & 0x1f) | nMintsLNew;
          (&nMintsF)[local_dc] = m;
        }
        local_dc = local_dc + 1;
      }
      else if (mNew == 1) {
        if ((nMintsFNew >> (bVar6 & 0x1f) & 1U) != 0) {
          nMintsLNew = 1 << ((char)local_90 + (char)local_44 & 0x1fU) | nMintsLNew;
          (&nSSet)[local_44] = m;
        }
        local_44 = local_44 + 1;
      }
      else if (mNew == 3) {
        if ((nMintsFNew >> (bVar6 & 0x1f) & 1U) != 0) {
          nMintsLNew = 1 << (bVar5 + (byte)local_8c & 0x1f) |
                       1 << ((byte)local_8c & 0x1f) | nMintsLNew;
          (&nFSet)[local_8c] = m;
        }
        local_8c = local_8c + 1;
      }
      else if (mNew != 0) {
        __assert_fail("Value == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifSat.c"
                      ,0xc6,
                      "int If_ManSatCheckXY(void *, int, word *, int, unsigned int, word *, word *, Vec_Int_t *)"
                     );
      }
    }
    if ((local_44 != pBSet[0xe]) || (local_dc != local_e0)) {
      __assert_fail("iBSet == nBSet && iFSet == nFSet",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifSat.c"
                    ,200,
                    "int If_ManSatCheckXY(void *, int, word *, int, unsigned int, word *, word *, Vec_Int_t *)"
                   );
    }
    iVar1 = Vec_IntEntry(vLits,nMintsLNew);
    iVar2 = nMintsLNew;
    if (iVar1 != -1) {
      __assert_fail("Vec_IntEntry(vLits, mNew) == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifSat.c"
                    ,0xc9,
                    "int If_ManSatCheckXY(void *, int, word *, int, unsigned int, word *, word *, Vec_Int_t *)"
                   );
    }
    iVar1 = Abc_TtGetBit(pTruth,nMintsFNew);
    Vec_IntWriteEntry(vLits,iVar2,iVar1);
  }
  m = 0;
  for (nMintsFNew = 0; iVar2 = nMintsFNew, iVar1 = Vec_IntSize(vLits), iVar2 < iVar1;
      nMintsFNew = nMintsFNew + 1) {
    mNew = Vec_IntEntry(vLits,nMintsFNew);
    iVar2 = m;
    if (-1 < mNew) {
      m = m + 1;
      iVar1 = Abc_Var2Lit(v * 2 + nMintsFNew,(uint)((mNew != 0 ^ 0xffU) & 1));
      Vec_IntWriteEntry(vLits,iVar2,iVar1);
    }
  }
  Vec_IntShrink(vLits,m);
  begin = Vec_IntArray(vLits);
  piVar3 = Vec_IntArray(vLits);
  iVar2 = Vec_IntSize(vLits);
  mNew = sat_solver_solve((sat_solver *)pSat,begin,piVar3 + iVar2,0,0,0,0);
  if (mNew == 1) {
    if ((pTBound != (word *)0x0) && (pTFree != (word *)0x0)) {
      if (nLutSize < local_90 + pBSet[0xe]) {
        __assert_fail("nSSet + nBSet <= nLutSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifSat.c"
                      ,0xdd,
                      "int If_ManSatCheckXY(void *, int, word *, int, unsigned int, word *, word *, Vec_Int_t *)"
                     );
      }
      *pTBound = 0;
      Res._0_4_ = 1 << ((char)local_90 + (char)pBSet[0xe] & 0x1fU);
      mNew = 1;
      for (nMintsFNew = 0; nMintsFNew < (int)Res; nMintsFNew = nMintsFNew + 1) {
        iVar2 = sat_solver_var_value((sat_solver *)pSat,nMintsFNew);
        if (iVar2 != 0) {
          Abc_TtSetBit(pTBound,nMintsFNew);
        }
      }
      wVar4 = Abc_Tt6Stretch(*pTBound,local_90 + pBSet[0xe]);
      *pTBound = wVar4;
      if (nLutSize < local_90 + local_e0 + 1) {
        __assert_fail("nSSet + nFSet + 1 <= nLutSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifSat.c"
                      ,0xe5,
                      "int If_ManSatCheckXY(void *, int, word *, int, unsigned int, word *, word *, Vec_Int_t *)"
                     );
      }
      *pTFree = 0;
      Res._0_4_ = 1 << ((char)local_90 + '\x01' + (char)local_e0 & 0x1fU);
      for (nMintsFNew = 0; nMintsFNew < (int)Res; nMintsFNew = nMintsFNew + 1) {
        iVar2 = sat_solver_var_value((sat_solver *)pSat,v + nMintsFNew);
        if (iVar2 != 0) {
          Abc_TtSetBit(pTFree,nMintsFNew);
        }
      }
      wVar4 = Abc_Tt6Stretch(*pTFree,local_90 + 1 + local_e0);
      *pTFree = wVar4;
      if ((nVars != 6) || (nLutSize != 4)) {
        return 1;
      }
      local_150 = If_ManSat6Truth(*pTBound,*pTFree,&nSSet,pBSet[0xe],&nFSet,local_90,&nMintsF,
                                  local_e0);
      if (*pTruth != local_150) {
        Dau_DsdPrintFromTruth(pTruth,6);
        Dau_DsdPrintFromTruth(&local_150,6);
        Dau_DsdPrintFromTruth(pTBound,local_90 + pBSet[0xe]);
        Dau_DsdPrintFromTruth(pTFree,local_90 + local_e0 + 1);
        printf("Verification failed!\n");
      }
    }
    pSat_local._4_4_ = 1;
  }
  else {
    pSat_local._4_4_ = 0;
  }
  return pSat_local._4_4_;
}

Assistant:

int If_ManSatCheckXY( void * pSat, int nLutSize, word * pTruth, int nVars, unsigned uSet, word * pTBound, word * pTFree, Vec_Int_t * vLits )
{
    sat_solver * p = (sat_solver *)pSat;
    int iBSet, nBSet = 0, pBSet[IF_MAX_FUNC_LUTSIZE];
    int iSSet, nSSet = 0, pSSet[IF_MAX_FUNC_LUTSIZE];
    int iFSet, nFSet = 0, pFSet[IF_MAX_FUNC_LUTSIZE];
    int nMintsL = (1 << nLutSize);
    int nMintsF = (1 << (2 * nLutSize - 1));
    int v, Value, m, mNew, nMintsFNew, nMintsLNew;
    word Res;
    // collect variable sets
    Dau_DecSortSet( uSet, nVars, &nBSet, &nSSet, &nFSet );
    assert( nBSet + nSSet + nFSet == nVars );
    // check variable bounds
    assert( nSSet + nBSet <= nLutSize );
    assert( nLutSize + nSSet + nFSet <= 2*nLutSize - 1 );
    nMintsFNew = (1 << (nLutSize + nSSet + nFSet));
    // remap minterms
    Vec_IntFill( vLits, nMintsF, -1 );
    for ( m = 0; m < (1 << nVars); m++ )
    {
        mNew = iBSet = iSSet = iFSet = 0;
        for ( v = 0; v < nVars; v++ )
        {
            Value = ((uSet >> (v << 1)) & 3);
            if ( Value == 0 ) // FS
            {
                if ( ((m >> v) & 1) )
                    mNew |= 1 << (nLutSize + nSSet + iFSet), pFSet[iFSet] = v;
                iFSet++;
            }
            else if ( Value == 1 ) // BS
            {
                if ( ((m >> v) & 1) )
                    mNew |= 1 << (nSSet + iBSet), pBSet[iBSet] = v;
                iBSet++;
            }
            else if ( Value == 3 ) // SS
            {
                if ( ((m >> v) & 1) )
                {
                    mNew |= 1 << iSSet;
                    mNew |= 1 << (nLutSize + iSSet);
                    pSSet[iSSet] = v;
                }
                iSSet++;
            }
            else assert( Value == 0 );
        }
        assert( iBSet == nBSet && iFSet == nFSet );
        assert( Vec_IntEntry(vLits, mNew) == -1 );
        Vec_IntWriteEntry( vLits, mNew, Abc_TtGetBit(pTruth, m) );
    }
    // find assumptions
    v = 0;
    Vec_IntForEachEntry( vLits, Value, m )
    {
//        printf( "%d", (Value >= 0) ? Value : 2 );
        if ( Value >= 0 )
            Vec_IntWriteEntry( vLits, v++, Abc_Var2Lit(2 * nMintsL + m, !Value) );
    }
    Vec_IntShrink( vLits, v );
//    printf( " %d\n", Vec_IntSize(vLits) );
    // run SAT solver
    Value = sat_solver_solve( p, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), 0, 0, 0, 0 );
    if ( Value != l_True )
        return 0;
    if ( pTBound && pTFree )
    {
        // collect config
        assert( nSSet + nBSet <= nLutSize );
        *pTBound = 0;
        nMintsLNew = (1 << (nSSet + nBSet));
        for ( m = 0; m < nMintsLNew; m++ )
            if ( sat_solver_var_value(p, m) )
                Abc_TtSetBit( pTBound, m );
        *pTBound = Abc_Tt6Stretch( *pTBound, nSSet + nBSet );
        // collect configs
        assert( nSSet + nFSet + 1 <= nLutSize );
        *pTFree = 0;
        nMintsLNew = (1 << (1 + nSSet + nFSet));
        for ( m = 0; m < nMintsLNew; m++ )
            if ( sat_solver_var_value(p, nMintsL+m) )
                Abc_TtSetBit( pTFree, m );
        *pTFree = Abc_Tt6Stretch( *pTFree, 1 + nSSet + nFSet );
        if ( nVars != 6 || nLutSize != 4 )
            return 1;
        // verify the result
        Res = If_ManSat6Truth( *pTBound, *pTFree, pBSet, nBSet, pSSet, nSSet, pFSet, nFSet );
        if ( pTruth[0] != Res )
        {
            Dau_DsdPrintFromTruth( pTruth,  nVars );
            Dau_DsdPrintFromTruth( &Res,    nVars );
            Dau_DsdPrintFromTruth( pTBound, nSSet+nBSet );
            Dau_DsdPrintFromTruth( pTFree,  nSSet+nFSet+1 );
            printf( "Verification failed!\n" );
        }
    }
    return 1;
}